

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

cmFileLockResult __thiscall
cmFileLockPool::ScopePool::Lock(ScopePool *this,string *filename,unsigned_long timeoutSec)

{
  pointer *pppcVar1;
  iterator __position;
  bool bVar2;
  cmFileLock *this_00;
  cmFileLockResult result;
  cmFileLock *lock;
  cmFileLockResult local_30;
  cmFileLock *local_28;
  
  this_00 = (cmFileLock *)operator_new(0x28);
  cmFileLock::cmFileLock(this_00);
  local_28 = this_00;
  local_30 = cmFileLock::Lock(this_00,filename,timeoutSec);
  bVar2 = cmFileLockResult::IsOk(&local_30);
  if (bVar2) {
    __position._M_current =
         (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmFileLock*,std::allocator<cmFileLock*>>::_M_realloc_insert<cmFileLock*const&>
                ((vector<cmFileLock*,std::allocator<cmFileLock*>> *)this,__position,&local_28);
    }
    else {
      *__position._M_current = this_00;
      pppcVar1 = &(this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
    local_30 = cmFileLockResult::MakeOk();
  }
  else {
    cmFileLock::~cmFileLock(this_00);
    operator_delete(this_00,0x28);
  }
  return local_30;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Lock(const std::string& filename,
                                                 unsigned long timeoutSec)
{
  cmFileLock* lock = new cmFileLock();
  const cmFileLockResult result = lock->Lock(filename, timeoutSec);
  if (result.IsOk()) {
    this->Locks.push_back(lock);
    return cmFileLockResult::MakeOk();
  }
  delete lock;
  return result;
}